

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[32],char[23],unsigned_int,char[43],unsigned_int,char[39],unsigned_int,char[34]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [32],char (*Args_1) [23],
          uint *Args_2,char (*Args_3) [43],uint *Args_4,char (*Args_5) [39],uint *Args_6,
          char (*Args_7) [34])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[32],char[23],unsigned_int,char[43],unsigned_int,char[39],unsigned_int,char[34]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [32])this,(char (*) [23])Args,(uint *)Args_1,(char (*) [43])Args_2,
             (uint *)Args_3,(char (*) [39])Args_4,(uint *)Args_5,(char (*) [34])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}